

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

int tcu::getPixelSize(TextureFormat format)

{
  int iVar1;
  int iVar2;
  ChannelType type;
  ChannelOrder order;
  TextureFormat format_local;
  
  type = format.order;
  order = format.type;
  switch(order) {
  case RGB:
  case sBGR:
    format_local.order = A;
    break;
  case RGBA:
  case ARGB:
  case BGR:
  case BGRA:
  case sR:
  case sBGRA:
  case D:
  case S:
    format_local.order = I;
    break;
  case sRG:
  case sRGB:
  case sRGBA:
  case DS:
  case CHANNELORDER_LAST:
  case DS|I:
  case DS|L:
  case sBGR|RGBA:
  case sBGR|ARGB:
  case sBGR|BGR:
    format_local.order = LA;
    break;
  default:
    iVar1 = getNumUsedChannels(type);
    iVar2 = getChannelSize(order);
    format_local.order = iVar1 * iVar2;
    break;
  case 0x25:
    format_local.order = RGBA;
  }
  return format_local.order;
}

Assistant:

int getPixelSize (TextureFormat format)
{
	const TextureFormat::ChannelOrder	order	= format.order;
	const TextureFormat::ChannelType	type	= format.type;

	DE_ASSERT(isValid(format));

	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::UNORM_BYTE_44:
		case TextureFormat::UNSIGNED_BYTE_44:
			return 1;

		case TextureFormat::UNORM_SHORT_565:
		case TextureFormat::UNORM_SHORT_555:
		case TextureFormat::UNORM_SHORT_4444:
		case TextureFormat::UNORM_SHORT_5551:
		case TextureFormat::UNORM_SHORT_1555:
		case TextureFormat::UNSIGNED_SHORT_565:
		case TextureFormat::UNSIGNED_SHORT_4444:
		case TextureFormat::UNSIGNED_SHORT_5551:
			return 2;

		case TextureFormat::UNORM_INT_101010:
		case TextureFormat::UNSIGNED_INT_999_E5_REV:
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
		case TextureFormat::SNORM_INT_1010102_REV:
		case TextureFormat::UNORM_INT_1010102_REV:
		case TextureFormat::SIGNED_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
		case TextureFormat::UNSIGNED_INT_24_8:
		case TextureFormat::UNSIGNED_INT_24_8_REV:
		case TextureFormat::UNSIGNED_INT_16_8_8:
			return 4;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			return 8;

		default:
			return getNumUsedChannels(order) * getChannelSize(type);
	}
}